

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

bool __thiscall
cmDependsFortran::Finalize(cmDependsFortran *this,ostream *makeDepends,ostream *internalDepends)

{
  _Rb_tree_node_base *p_Var1;
  undefined1 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  cmMakefile *this_00;
  pointer pcVar4;
  size_type sVar5;
  cmDependsFortranInternals *pcVar6;
  bool bVar7;
  string *psVar8;
  _Base_ptr p_Var9;
  ostream *poVar10;
  _Rb_tree_node_base *p_Var11;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  _Base_ptr p_Var12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  string mod_dir;
  string local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_648;
  undefined8 local_640;
  undefined1 local_630 [32];
  undefined1 *local_610;
  undefined8 local_608;
  _Base_ptr local_600;
  undefined8 local_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  char *local_5e0;
  undefined8 local_5d8;
  string local_5d0;
  string mod_upper;
  string stamp;
  string mod_lower;
  string fcName;
  string fiName;
  cmGeneratedFileStream fiStream;
  cmGeneratedFileStream fcStream;
  
  bVar7 = LocateModules(this);
  if (bVar7) {
    this_00 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
              super_cmLocalGenerator.Makefile;
    puVar2 = &fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)puVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fiStream,"CMAKE_Fortran_TARGET_MODULE_DIR","");
    psVar8 = cmMakefile::GetSafeDefinition(this_00,(string *)&fiStream);
    mod_dir._M_dataplus._M_p = (pointer)&mod_dir.field_2;
    pcVar4 = (psVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&mod_dir,pcVar4,pcVar4 + psVar8->_M_string_length);
    if (fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream != (_func_int **)puVar2) {
      operator_delete(fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _16_8_ + 1);
    }
    if (mod_dir._M_string_length == 0) {
      cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                ((cmLocalGenerator *)(this->super_cmDepends).LocalGenerator);
      std::__cxx11::string::_M_assign((string *)&mod_dir);
    }
    fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)puVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fiStream,"CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES","");
    psVar8 = cmMakefile::GetSafeDefinition(this_00,(string *)&fiStream);
    sVar5 = psVar8->_M_string_length;
    if (fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream != (_func_int **)puVar2) {
      operator_delete(fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _16_8_ + 1);
    }
    pcVar6 = (this->Internal)._M_t.
             super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
             .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl;
    p_Var9 = *(_Base_ptr *)((long)&(pcVar6->ObjectInfo)._M_t + 0x18);
    p_Var12 = (_Base_ptr)((long)&(pcVar6->ObjectInfo)._M_t + 8);
    if (p_Var9 != p_Var12) {
      do {
        WriteDependenciesReal
                  (this,(string *)(p_Var9 + 1),(cmFortranSourceInfo *)(p_Var9 + 2),&mod_dir,
                   &(this->super_cmDepends).TargetDirectory,makeDepends,internalDepends,sVar5 != 0);
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != p_Var12);
    }
    fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
    fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)(this->super_cmDepends).TargetDirectory._M_string_length;
    fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
    fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0x11;
    fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
         anon_var_dwarf_27fff2d;
    fiStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
    views._M_len = 2;
    views._M_array = (iterator)&fiStream;
    cmCatViews(&fiName,views);
    cmGeneratedFileStream::cmGeneratedFileStream(&fiStream,&fiName,false,None);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&fiStream,"# The fortran modules provided by this target.\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fiStream,"provides\n",9);
    pcVar6 = (this->Internal)._M_t.
             super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
             .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl;
    p_Var11 = *(_Base_ptr *)((long)&(pcVar6->TargetProvides)._M_t + 0x18);
    p_Var1 = (_Rb_tree_node_base *)((long)&(pcVar6->TargetProvides)._M_t + 8);
    if (p_Var11 != p_Var1) {
      do {
        fcStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream =
             (_func_int **)
             CONCAT71(fcStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream._1_7_,0x20);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&fiStream,(char *)&fcStream,1);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
        fcStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream =
             (_func_int **)
             CONCAT71(fcStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&fcStream,1);
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while (p_Var11 != p_Var1);
    }
    if (*(size_t *)((long)&(pcVar6->TargetProvides)._M_t + 0x28) != 0) {
      fcStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
           (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
      fcStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
           = (_func_int **)(this->super_cmDepends).TargetDirectory._M_string_length;
      fcStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
      fcStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0x1a;
      fcStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
           anon_var_dwarf_27fff6a;
      fcStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&fcStream;
      cmCatViews(&fcName,views_00);
      cmGeneratedFileStream::cmGeneratedFileStream(&fcStream,&fcName,false,None);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fcStream,"# Remove fortran modules provided by this target.\n",0x32);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fcStream,"FILE(REMOVE",0xb);
      p_Var11 = *(_Base_ptr *)((long)&(pcVar6->TargetProvides)._M_t + 0x18);
      if (p_Var11 != p_Var1) {
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_630 + 0x18);
        do {
          local_668._M_dataplus._M_p = (pointer)mod_dir._M_string_length;
          local_668._M_string_length = (size_type)mod_dir._M_dataplus._M_p;
          local_668.field_2._M_allocated_capacity = 0;
          local_630._0_8_ = (pointer)0x0;
          local_630._8_8_ = &DAT_00000001;
          local_630[0x18] = '/';
          local_668.field_2._8_8_ = 1;
          local_640 = 0;
          views_01._M_len = 2;
          views_01._M_array = (iterator)&local_668;
          local_648 = pbVar3;
          local_630._16_8_ = pbVar3;
          cmCatViews(&mod_upper,views_01);
          local_668._M_dataplus._M_p = (pointer)mod_dir._M_string_length;
          local_668._M_string_length = (size_type)mod_dir._M_dataplus._M_p;
          local_668.field_2._M_allocated_capacity = 0;
          local_630._0_8_ = (pointer)0x0;
          local_630._8_8_ = &DAT_00000001;
          local_630[0x18] = 0x2f;
          local_668.field_2._8_8_ = 1;
          local_640 = 0;
          views_02._M_len = 2;
          views_02._M_array = (iterator)&local_668;
          local_648 = pbVar3;
          local_630._16_8_ = pbVar3;
          cmCatViews(&mod_lower,views_02);
          cmFortranModuleAppendUpperLower((string *)(p_Var11 + 1),&mod_upper,&mod_lower);
          local_630._8_8_ = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
          local_630._0_8_ = (this->super_cmDepends).TargetDirectory._M_string_length;
          local_630._16_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_668._M_dataplus._M_p = (char *)0x0;
          local_668._M_string_length = (size_type)&DAT_00000001;
          local_668.field_2._M_allocated_capacity = (long)&local_668.field_2 + 8;
          local_668.field_2._M_local_buf[8] = 0x2f;
          local_630._24_8_ = 1;
          local_608 = 0;
          local_5f8 = *(undefined8 *)(p_Var11 + 1);
          local_600 = p_Var11[1]._M_parent;
          local_5f0 = 0;
          local_5e8 = 6;
          local_5e0 = ".stamp";
          local_5d8 = 0;
          views_03._M_len = 4;
          views_03._M_array = (iterator)local_630;
          local_610 = (undefined1 *)local_668.field_2._M_allocated_capacity;
          cmCatViews(&stamp,views_03);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fcStream,"\n  \"",4);
          cmOutputConverter::MaybeRelativeToCurBinDir
                    ((string *)local_630,(cmOutputConverter *)(this->super_cmDepends).LocalGenerator
                     ,&mod_lower);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&fcStream,(char *)local_630._0_8_,local_630._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n  \"",5);
          cmOutputConverter::MaybeRelativeToCurBinDir
                    (&local_668,(cmOutputConverter *)(this->super_cmDepends).LocalGenerator,
                     &mod_upper);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_668._M_dataplus._M_p,local_668._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n  \"",5);
          cmOutputConverter::MaybeRelativeToCurBinDir
                    (&local_5d0,(cmOutputConverter *)(this->super_cmDepends).LocalGenerator,&stamp);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_5d0._M_dataplus._M_p,local_5d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
            operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_668._M_dataplus._M_p != &local_668.field_2) {
            operator_delete(local_668._M_dataplus._M_p,
                            (ulong)(local_668.field_2._M_allocated_capacity + 1));
          }
          if ((undefined1 *)local_630._0_8_ != local_630 + 0x10) {
            operator_delete((void *)local_630._0_8_,(ulong)(local_630._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)stamp._M_dataplus._M_p != &stamp.field_2) {
            operator_delete(stamp._M_dataplus._M_p,stamp.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)mod_lower._M_dataplus._M_p != &mod_lower.field_2) {
            operator_delete(mod_lower._M_dataplus._M_p,mod_lower.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)mod_upper._M_dataplus._M_p != &mod_upper.field_2) {
            operator_delete(mod_upper._M_dataplus._M_p,mod_upper.field_2._M_allocated_capacity + 1);
          }
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != p_Var1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fcStream,"  )\n",4);
      cmGeneratedFileStream::~cmGeneratedFileStream(&fcStream);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fcName._M_dataplus._M_p != &fcName.field_2) {
        operator_delete(fcName._M_dataplus._M_p,fcName.field_2._M_allocated_capacity + 1);
      }
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&fiStream);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fiName._M_dataplus._M_p != &fiName.field_2) {
      operator_delete(fiName._M_dataplus._M_p,fiName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)mod_dir._M_dataplus._M_p != &mod_dir.field_2) {
      operator_delete(mod_dir._M_dataplus._M_p,mod_dir.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar7;
}

Assistant:

bool cmDependsFortran::Finalize(std::ostream& makeDepends,
                                std::ostream& internalDepends)
{
  // Prepare the module search process.
  if (!this->LocateModules()) {
    return false;
  }

  // Get the directory in which stamp files will be stored.
  const std::string& stamp_dir = this->TargetDirectory;

  // Get the directory in which module files will be created.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  std::string mod_dir =
    mf->GetSafeDefinition("CMAKE_Fortran_TARGET_MODULE_DIR");
  if (mod_dir.empty()) {
    mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  }

  bool building_intrinsics =
    !mf->GetSafeDefinition("CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES")
       .empty();

  // Actually write dependencies to the streams.
  using ObjectInfoMap = cmDependsFortranInternals::ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for (auto const& i : objInfo) {
    if (!this->WriteDependenciesReal(i.first, i.second, mod_dir, stamp_dir,
                                     makeDepends, internalDepends,
                                     building_intrinsics)) {
      return false;
    }
  }

  // Store the list of modules provided by this target.
  std::string fiName = cmStrCat(this->TargetDirectory, "/fortran.internal");
  cmGeneratedFileStream fiStream(fiName);
  fiStream << "# The fortran modules provided by this target.\n";
  fiStream << "provides\n";
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::string const& i : provides) {
    fiStream << ' ' << i << '\n';
  }

  // Create a script to clean the modules.
  if (!provides.empty()) {
    std::string fcName =
      cmStrCat(this->TargetDirectory, "/cmake_clean_Fortran.cmake");
    cmGeneratedFileStream fcStream(fcName);
    fcStream << "# Remove fortran modules provided by this target.\n";
    fcStream << "FILE(REMOVE";
    for (std::string const& i : provides) {
      std::string mod_upper = cmStrCat(mod_dir, '/');
      std::string mod_lower = cmStrCat(mod_dir, '/');
      cmFortranModuleAppendUpperLower(i, mod_upper, mod_lower);
      std::string stamp = cmStrCat(stamp_dir, '/', i, ".stamp");
      fcStream << "\n"
                  "  \""
               << this->LocalGenerator->MaybeRelativeToCurBinDir(mod_lower)
               << "\"\n"
                  "  \""
               << this->LocalGenerator->MaybeRelativeToCurBinDir(mod_upper)
               << "\"\n"
                  "  \""
               << this->LocalGenerator->MaybeRelativeToCurBinDir(stamp)
               << "\"\n";
    }
    fcStream << "  )\n";
  }
  return true;
}